

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor_database.cc
# Opt level: O2

bool __thiscall
google::protobuf::EncodedDescriptorDatabase::FindFileContainingExtension
          (EncodedDescriptorDatabase *this,string *containing_type,int field_number,
          FileDescriptorProto *output)

{
  bool bVar1;
  DescriptorIndex *this_00;
  pair<const_void_*,_int> encoded_file;
  StringPiece local_30;
  
  this_00 = (this->index_)._M_t.
            super___uniq_ptr_impl<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex,_std::default_delete<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex>_>
            ._M_t.
            super__Tuple_impl<0UL,_google::protobuf::EncodedDescriptorDatabase::DescriptorIndex_*,_std::default_delete<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex>_>
            .
            super__Head_base<0UL,_google::protobuf::EncodedDescriptorDatabase::DescriptorIndex_*,_false>
            ._M_head_impl;
  stringpiece_internal::StringPiece::StringPiece<std::allocator<char>>(&local_30,containing_type);
  encoded_file = DescriptorIndex::FindExtension(this_00,local_30,field_number);
  bVar1 = MaybeParse((EncodedDescriptorDatabase *)this_00,encoded_file,output);
  return bVar1;
}

Assistant:

bool EncodedDescriptorDatabase::FindFileContainingExtension(
    const std::string& containing_type, int field_number,
    FileDescriptorProto* output) {
  return MaybeParse(index_->FindExtension(containing_type, field_number),
                    output);
}